

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_blend_popcnt_unroll8(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  int *piVar2;
  ushort uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  ulong uVar252;
  byte bVar253;
  byte bVar254;
  byte bVar255;
  byte bVar256;
  byte bVar257;
  byte bVar258;
  byte bVar259;
  byte bVar260;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  long lVar263;
  ulong uVar264;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  
  auVar262 = _DAT_0010da60;
  auVar261 = _DAT_0010da40;
  uVar252 = (ulong)(len >> 4);
  uVar264 = 0;
  while (uVar1 = uVar264 + 8, uVar1 <= uVar252) {
    lVar263 = 0x20;
    auVar265 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10),auVar261,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x10));
    auVar266 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x10),auVar262,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10));
    auVar267 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x20),auVar261,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x30));
    auVar268 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x30),auVar262,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x20));
    auVar269 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x40),auVar261,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x50));
    auVar270 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x50),auVar262,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x40));
    auVar271 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x60),auVar261,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x70));
    auVar272 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x70),auVar262,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x60));
    for (; uVar264 = uVar1, lVar263 != 0; lVar263 = lVar263 + -4) {
      auVar4 = auVar267 >> 7;
      auVar12 = auVar267 >> 0xf;
      auVar20 = auVar267 >> 0x17;
      auVar28 = auVar267 >> 0x1f;
      auVar36 = auVar267 >> 0x27;
      auVar44 = auVar267 >> 0x2f;
      auVar52 = auVar267 >> 0x37;
      auVar60 = auVar267 >> 0x3f;
      auVar68 = auVar267 >> 0x47;
      auVar76 = auVar267 >> 0x4f;
      auVar84 = auVar267 >> 0x57;
      auVar92 = auVar267 >> 0x5f;
      auVar100 = auVar267 >> 0x67;
      auVar108 = auVar267 >> 0x6f;
      auVar116 = auVar267 >> 0x77;
      auVar124 = auVar267 >> 0x7f;
      auVar132 = auVar267 >> 0x87;
      auVar140 = auVar267 >> 0x8f;
      auVar148 = auVar267 >> 0x97;
      auVar156 = auVar267 >> 0x9f;
      auVar164 = auVar267 >> 0xa7;
      auVar172 = auVar267 >> 0xaf;
      auVar180 = auVar267 >> 0xb7;
      auVar188 = auVar267 >> 0xbf;
      auVar196 = auVar267 >> 199;
      auVar204 = auVar267 >> 0xcf;
      auVar212 = auVar267 >> 0xd7;
      auVar220 = auVar267 >> 0xdf;
      auVar228 = auVar267 >> 0xe7;
      auVar236 = auVar267 >> 0xef;
      auVar244 = auVar267 >> 0xf7;
      bVar253 = auVar267[0x1f];
      auVar5 = auVar269 >> 7;
      auVar13 = auVar269 >> 0xf;
      auVar21 = auVar269 >> 0x17;
      auVar29 = auVar269 >> 0x1f;
      auVar37 = auVar269 >> 0x27;
      auVar45 = auVar269 >> 0x2f;
      auVar53 = auVar269 >> 0x37;
      auVar61 = auVar269 >> 0x3f;
      auVar69 = auVar269 >> 0x47;
      auVar77 = auVar269 >> 0x4f;
      auVar85 = auVar269 >> 0x57;
      auVar93 = auVar269 >> 0x5f;
      auVar101 = auVar269 >> 0x67;
      auVar109 = auVar269 >> 0x6f;
      auVar117 = auVar269 >> 0x77;
      auVar125 = auVar269 >> 0x7f;
      auVar133 = auVar269 >> 0x87;
      auVar141 = auVar269 >> 0x8f;
      auVar149 = auVar269 >> 0x97;
      auVar157 = auVar269 >> 0x9f;
      auVar165 = auVar269 >> 0xa7;
      auVar173 = auVar269 >> 0xaf;
      auVar181 = auVar269 >> 0xb7;
      auVar189 = auVar269 >> 0xbf;
      auVar197 = auVar269 >> 199;
      auVar205 = auVar269 >> 0xcf;
      auVar213 = auVar269 >> 0xd7;
      auVar221 = auVar269 >> 0xdf;
      auVar229 = auVar269 >> 0xe7;
      auVar237 = auVar269 >> 0xef;
      auVar245 = auVar269 >> 0xf7;
      bVar254 = auVar269[0x1f];
      auVar6 = auVar265 >> 7;
      auVar14 = auVar265 >> 0xf;
      auVar22 = auVar265 >> 0x17;
      auVar30 = auVar265 >> 0x1f;
      auVar38 = auVar265 >> 0x27;
      auVar46 = auVar265 >> 0x2f;
      auVar54 = auVar265 >> 0x37;
      auVar62 = auVar265 >> 0x3f;
      auVar70 = auVar265 >> 0x47;
      auVar78 = auVar265 >> 0x4f;
      auVar86 = auVar265 >> 0x57;
      auVar94 = auVar265 >> 0x5f;
      auVar102 = auVar265 >> 0x67;
      auVar110 = auVar265 >> 0x6f;
      auVar118 = auVar265 >> 0x77;
      auVar126 = auVar265 >> 0x7f;
      auVar134 = auVar265 >> 0x87;
      auVar142 = auVar265 >> 0x8f;
      auVar150 = auVar265 >> 0x97;
      auVar158 = auVar265 >> 0x9f;
      auVar166 = auVar265 >> 0xa7;
      auVar174 = auVar265 >> 0xaf;
      auVar182 = auVar265 >> 0xb7;
      auVar190 = auVar265 >> 0xbf;
      auVar198 = auVar265 >> 199;
      auVar206 = auVar265 >> 0xcf;
      auVar214 = auVar265 >> 0xd7;
      auVar222 = auVar265 >> 0xdf;
      auVar230 = auVar265 >> 0xe7;
      auVar238 = auVar265 >> 0xef;
      auVar246 = auVar265 >> 0xf7;
      bVar255 = auVar265[0x1f];
      auVar7 = auVar268 >> 7;
      auVar15 = auVar268 >> 0xf;
      auVar23 = auVar268 >> 0x17;
      auVar31 = auVar268 >> 0x1f;
      auVar39 = auVar268 >> 0x27;
      auVar47 = auVar268 >> 0x2f;
      auVar55 = auVar268 >> 0x37;
      auVar63 = auVar268 >> 0x3f;
      auVar71 = auVar268 >> 0x47;
      auVar79 = auVar268 >> 0x4f;
      auVar87 = auVar268 >> 0x57;
      auVar95 = auVar268 >> 0x5f;
      auVar103 = auVar268 >> 0x67;
      auVar111 = auVar268 >> 0x6f;
      auVar119 = auVar268 >> 0x77;
      auVar127 = auVar268 >> 0x7f;
      auVar135 = auVar268 >> 0x87;
      auVar143 = auVar268 >> 0x8f;
      auVar151 = auVar268 >> 0x97;
      auVar159 = auVar268 >> 0x9f;
      auVar167 = auVar268 >> 0xa7;
      auVar175 = auVar268 >> 0xaf;
      auVar183 = auVar268 >> 0xb7;
      auVar191 = auVar268 >> 0xbf;
      auVar199 = auVar268 >> 199;
      auVar207 = auVar268 >> 0xcf;
      auVar215 = auVar268 >> 0xd7;
      auVar223 = auVar268 >> 0xdf;
      auVar231 = auVar268 >> 0xe7;
      auVar239 = auVar268 >> 0xef;
      auVar247 = auVar268 >> 0xf7;
      bVar256 = auVar268[0x1f];
      auVar8 = auVar266 >> 7;
      auVar16 = auVar266 >> 0xf;
      auVar24 = auVar266 >> 0x17;
      auVar32 = auVar266 >> 0x1f;
      auVar40 = auVar266 >> 0x27;
      auVar48 = auVar266 >> 0x2f;
      auVar56 = auVar266 >> 0x37;
      auVar64 = auVar266 >> 0x3f;
      auVar72 = auVar266 >> 0x47;
      auVar80 = auVar266 >> 0x4f;
      auVar88 = auVar266 >> 0x57;
      auVar96 = auVar266 >> 0x5f;
      auVar104 = auVar266 >> 0x67;
      auVar112 = auVar266 >> 0x6f;
      auVar120 = auVar266 >> 0x77;
      auVar128 = auVar266 >> 0x7f;
      auVar136 = auVar266 >> 0x87;
      auVar144 = auVar266 >> 0x8f;
      auVar152 = auVar266 >> 0x97;
      auVar160 = auVar266 >> 0x9f;
      auVar168 = auVar266 >> 0xa7;
      auVar176 = auVar266 >> 0xaf;
      auVar184 = auVar266 >> 0xb7;
      auVar192 = auVar266 >> 0xbf;
      auVar200 = auVar266 >> 199;
      auVar208 = auVar266 >> 0xcf;
      auVar216 = auVar266 >> 0xd7;
      auVar224 = auVar266 >> 0xdf;
      auVar232 = auVar266 >> 0xe7;
      auVar240 = auVar266 >> 0xef;
      auVar248 = auVar266 >> 0xf7;
      bVar257 = auVar266[0x1f];
      auVar265 = vpaddb_avx2(auVar265,auVar265);
      auVar266 = vpaddb_avx2(auVar266,auVar266);
      auVar267 = vpaddb_avx2(auVar267,auVar267);
      auVar268 = vpaddb_avx2(auVar268,auVar268);
      auVar269 = vpaddb_avx2(auVar269,auVar269);
      auVar9 = auVar270 >> 7;
      auVar17 = auVar270 >> 0xf;
      auVar25 = auVar270 >> 0x17;
      auVar33 = auVar270 >> 0x1f;
      auVar41 = auVar270 >> 0x27;
      auVar49 = auVar270 >> 0x2f;
      auVar57 = auVar270 >> 0x37;
      auVar65 = auVar270 >> 0x3f;
      auVar73 = auVar270 >> 0x47;
      auVar81 = auVar270 >> 0x4f;
      auVar89 = auVar270 >> 0x57;
      auVar97 = auVar270 >> 0x5f;
      auVar105 = auVar270 >> 0x67;
      auVar113 = auVar270 >> 0x6f;
      auVar121 = auVar270 >> 0x77;
      auVar129 = auVar270 >> 0x7f;
      auVar137 = auVar270 >> 0x87;
      auVar145 = auVar270 >> 0x8f;
      auVar153 = auVar270 >> 0x97;
      auVar161 = auVar270 >> 0x9f;
      auVar169 = auVar270 >> 0xa7;
      auVar177 = auVar270 >> 0xaf;
      auVar185 = auVar270 >> 0xb7;
      auVar193 = auVar270 >> 0xbf;
      auVar201 = auVar270 >> 199;
      auVar209 = auVar270 >> 0xcf;
      auVar217 = auVar270 >> 0xd7;
      auVar225 = auVar270 >> 0xdf;
      auVar233 = auVar270 >> 0xe7;
      auVar241 = auVar270 >> 0xef;
      auVar249 = auVar270 >> 0xf7;
      bVar258 = auVar270[0x1f];
      auVar270 = vpaddb_avx2(auVar270,auVar270);
      auVar10 = auVar271 >> 7;
      auVar18 = auVar271 >> 0xf;
      auVar26 = auVar271 >> 0x17;
      auVar34 = auVar271 >> 0x1f;
      auVar42 = auVar271 >> 0x27;
      auVar50 = auVar271 >> 0x2f;
      auVar58 = auVar271 >> 0x37;
      auVar66 = auVar271 >> 0x3f;
      auVar74 = auVar271 >> 0x47;
      auVar82 = auVar271 >> 0x4f;
      auVar90 = auVar271 >> 0x57;
      auVar98 = auVar271 >> 0x5f;
      auVar106 = auVar271 >> 0x67;
      auVar114 = auVar271 >> 0x6f;
      auVar122 = auVar271 >> 0x77;
      auVar130 = auVar271 >> 0x7f;
      auVar138 = auVar271 >> 0x87;
      auVar146 = auVar271 >> 0x8f;
      auVar154 = auVar271 >> 0x97;
      auVar162 = auVar271 >> 0x9f;
      auVar170 = auVar271 >> 0xa7;
      auVar178 = auVar271 >> 0xaf;
      auVar186 = auVar271 >> 0xb7;
      auVar194 = auVar271 >> 0xbf;
      auVar202 = auVar271 >> 199;
      auVar210 = auVar271 >> 0xcf;
      auVar218 = auVar271 >> 0xd7;
      auVar226 = auVar271 >> 0xdf;
      auVar234 = auVar271 >> 0xe7;
      auVar242 = auVar271 >> 0xef;
      auVar250 = auVar271 >> 0xf7;
      bVar259 = auVar271[0x1f];
      auVar271 = vpaddb_avx2(auVar271,auVar271);
      auVar11 = auVar272 >> 7;
      auVar19 = auVar272 >> 0xf;
      auVar27 = auVar272 >> 0x17;
      auVar35 = auVar272 >> 0x1f;
      auVar43 = auVar272 >> 0x27;
      auVar51 = auVar272 >> 0x2f;
      auVar59 = auVar272 >> 0x37;
      auVar67 = auVar272 >> 0x3f;
      auVar75 = auVar272 >> 0x47;
      auVar83 = auVar272 >> 0x4f;
      auVar91 = auVar272 >> 0x57;
      auVar99 = auVar272 >> 0x5f;
      auVar107 = auVar272 >> 0x67;
      auVar115 = auVar272 >> 0x6f;
      auVar123 = auVar272 >> 0x77;
      auVar131 = auVar272 >> 0x7f;
      auVar139 = auVar272 >> 0x87;
      auVar147 = auVar272 >> 0x8f;
      auVar155 = auVar272 >> 0x97;
      auVar163 = auVar272 >> 0x9f;
      auVar171 = auVar272 >> 0xa7;
      auVar179 = auVar272 >> 0xaf;
      auVar187 = auVar272 >> 0xb7;
      auVar195 = auVar272 >> 0xbf;
      auVar203 = auVar272 >> 199;
      auVar211 = auVar272 >> 0xcf;
      auVar219 = auVar272 >> 0xd7;
      auVar227 = auVar272 >> 0xdf;
      auVar235 = auVar272 >> 0xe7;
      auVar243 = auVar272 >> 0xef;
      auVar251 = auVar272 >> 0xf7;
      bVar260 = auVar272[0x1f];
      auVar272 = vpaddb_avx2(auVar272,auVar272);
      *(int *)((long)flags + lVar263 + -4) =
           POPCOUNT((uint)(auVar10[0] & 1) | (uint)(auVar18[0] & 1) << 1 |
                    (uint)(auVar26[0] & 1) << 2 | (uint)(auVar34[0] & 1) << 3 |
                    (uint)(auVar42[0] & 1) << 4 | (uint)(auVar50[0] & 1) << 5 |
                    (uint)(auVar58[0] & 1) << 6 | (uint)(auVar66[0] & 1) << 7 |
                    (uint)(auVar74[0] & 1) << 8 | (uint)(auVar82[0] & 1) << 9 |
                    (uint)(auVar90[0] & 1) << 10 | (uint)(auVar98[0] & 1) << 0xb |
                    (uint)(auVar106[0] & 1) << 0xc | (uint)(auVar114[0] & 1) << 0xd |
                    (uint)(auVar122[0] & 1) << 0xe | (uint)auVar130[0] << 0xf |
                    (uint)(auVar138[0] & 1) << 0x10 | (uint)(auVar146[0] & 1) << 0x11 |
                    (uint)(auVar154[0] & 1) << 0x12 | (uint)(auVar162[0] & 1) << 0x13 |
                    (uint)(auVar170[0] & 1) << 0x14 | (uint)(auVar178[0] & 1) << 0x15 |
                    (uint)(auVar186[0] & 1) << 0x16 | (uint)auVar194[0] << 0x17 |
                    (uint)(auVar202[0] & 1) << 0x18 | (uint)(auVar210[0] & 1) << 0x19 |
                    (uint)(auVar218[0] & 1) << 0x1a | (uint)(auVar226[0] & 1) << 0x1b |
                    (uint)(auVar234[0] & 1) << 0x1c | (uint)(auVar242[0] & 1) << 0x1d |
                    (uint)(auVar250[0] & 1) << 0x1e | (uint)(bVar259 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar5[0] & 1) | (uint)(auVar13[0] & 1) << 1 |
                    (uint)(auVar21[0] & 1) << 2 | (uint)(auVar29[0] & 1) << 3 |
                    (uint)(auVar37[0] & 1) << 4 | (uint)(auVar45[0] & 1) << 5 |
                    (uint)(auVar53[0] & 1) << 6 | (uint)(auVar61[0] & 1) << 7 |
                    (uint)(auVar69[0] & 1) << 8 | (uint)(auVar77[0] & 1) << 9 |
                    (uint)(auVar85[0] & 1) << 10 | (uint)(auVar93[0] & 1) << 0xb |
                    (uint)(auVar101[0] & 1) << 0xc | (uint)(auVar109[0] & 1) << 0xd |
                    (uint)(auVar117[0] & 1) << 0xe | (uint)auVar125[0] << 0xf |
                    (uint)(auVar133[0] & 1) << 0x10 | (uint)(auVar141[0] & 1) << 0x11 |
                    (uint)(auVar149[0] & 1) << 0x12 | (uint)(auVar157[0] & 1) << 0x13 |
                    (uint)(auVar165[0] & 1) << 0x14 | (uint)(auVar173[0] & 1) << 0x15 |
                    (uint)(auVar181[0] & 1) << 0x16 | (uint)auVar189[0] << 0x17 |
                    (uint)(auVar197[0] & 1) << 0x18 | (uint)(auVar205[0] & 1) << 0x19 |
                    (uint)(auVar213[0] & 1) << 0x1a | (uint)(auVar221[0] & 1) << 0x1b |
                    (uint)(auVar229[0] & 1) << 0x1c | (uint)(auVar237[0] & 1) << 0x1d |
                    (uint)(auVar245[0] & 1) << 0x1e | (uint)(bVar254 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar4[0] & 1) | (uint)(auVar12[0] & 1) << 1 |
                    (uint)(auVar20[0] & 1) << 2 | (uint)(auVar28[0] & 1) << 3 |
                    (uint)(auVar36[0] & 1) << 4 | (uint)(auVar44[0] & 1) << 5 |
                    (uint)(auVar52[0] & 1) << 6 | (uint)(auVar60[0] & 1) << 7 |
                    (uint)(auVar68[0] & 1) << 8 | (uint)(auVar76[0] & 1) << 9 |
                    (uint)(auVar84[0] & 1) << 10 | (uint)(auVar92[0] & 1) << 0xb |
                    (uint)(auVar100[0] & 1) << 0xc | (uint)(auVar108[0] & 1) << 0xd |
                    (uint)(auVar116[0] & 1) << 0xe | (uint)auVar124[0] << 0xf |
                    (uint)(auVar132[0] & 1) << 0x10 | (uint)(auVar140[0] & 1) << 0x11 |
                    (uint)(auVar148[0] & 1) << 0x12 | (uint)(auVar156[0] & 1) << 0x13 |
                    (uint)(auVar164[0] & 1) << 0x14 | (uint)(auVar172[0] & 1) << 0x15 |
                    (uint)(auVar180[0] & 1) << 0x16 | (uint)auVar188[0] << 0x17 |
                    (uint)(auVar196[0] & 1) << 0x18 | (uint)(auVar204[0] & 1) << 0x19 |
                    (uint)(auVar212[0] & 1) << 0x1a | (uint)(auVar220[0] & 1) << 0x1b |
                    (uint)(auVar228[0] & 1) << 0x1c | (uint)(auVar236[0] & 1) << 0x1d |
                    (uint)(auVar244[0] & 1) << 0x1e | (uint)(bVar253 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar6[0] & 1) | (uint)(auVar14[0] & 1) << 1 |
                    (uint)(auVar22[0] & 1) << 2 | (uint)(auVar30[0] & 1) << 3 |
                    (uint)(auVar38[0] & 1) << 4 | (uint)(auVar46[0] & 1) << 5 |
                    (uint)(auVar54[0] & 1) << 6 | (uint)(auVar62[0] & 1) << 7 |
                    (uint)(auVar70[0] & 1) << 8 | (uint)(auVar78[0] & 1) << 9 |
                    (uint)(auVar86[0] & 1) << 10 | (uint)(auVar94[0] & 1) << 0xb |
                    (uint)(auVar102[0] & 1) << 0xc | (uint)(auVar110[0] & 1) << 0xd |
                    (uint)(auVar118[0] & 1) << 0xe | (uint)auVar126[0] << 0xf |
                    (uint)(auVar134[0] & 1) << 0x10 | (uint)(auVar142[0] & 1) << 0x11 |
                    (uint)(auVar150[0] & 1) << 0x12 | (uint)(auVar158[0] & 1) << 0x13 |
                    (uint)(auVar166[0] & 1) << 0x14 | (uint)(auVar174[0] & 1) << 0x15 |
                    (uint)(auVar182[0] & 1) << 0x16 | (uint)auVar190[0] << 0x17 |
                    (uint)(auVar198[0] & 1) << 0x18 | (uint)(auVar206[0] & 1) << 0x19 |
                    (uint)(auVar214[0] & 1) << 0x1a | (uint)(auVar222[0] & 1) << 0x1b |
                    (uint)(auVar230[0] & 1) << 0x1c | (uint)(auVar238[0] & 1) << 0x1d |
                    (uint)(auVar246[0] & 1) << 0x1e | (uint)(bVar255 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar263 + -4);
      *(int *)((long)flags + lVar263 + 0x1c) =
           POPCOUNT((uint)(auVar11[0] & 1) | (uint)(auVar19[0] & 1) << 1 |
                    (uint)(auVar27[0] & 1) << 2 | (uint)(auVar35[0] & 1) << 3 |
                    (uint)(auVar43[0] & 1) << 4 | (uint)(auVar51[0] & 1) << 5 |
                    (uint)(auVar59[0] & 1) << 6 | (uint)(auVar67[0] & 1) << 7 |
                    (uint)(auVar75[0] & 1) << 8 | (uint)(auVar83[0] & 1) << 9 |
                    (uint)(auVar91[0] & 1) << 10 | (uint)(auVar99[0] & 1) << 0xb |
                    (uint)(auVar107[0] & 1) << 0xc | (uint)(auVar115[0] & 1) << 0xd |
                    (uint)(auVar123[0] & 1) << 0xe | (uint)auVar131[0] << 0xf |
                    (uint)(auVar139[0] & 1) << 0x10 | (uint)(auVar147[0] & 1) << 0x11 |
                    (uint)(auVar155[0] & 1) << 0x12 | (uint)(auVar163[0] & 1) << 0x13 |
                    (uint)(auVar171[0] & 1) << 0x14 | (uint)(auVar179[0] & 1) << 0x15 |
                    (uint)(auVar187[0] & 1) << 0x16 | (uint)auVar195[0] << 0x17 |
                    (uint)(auVar203[0] & 1) << 0x18 | (uint)(auVar211[0] & 1) << 0x19 |
                    (uint)(auVar219[0] & 1) << 0x1a | (uint)(auVar227[0] & 1) << 0x1b |
                    (uint)(auVar235[0] & 1) << 0x1c | (uint)(auVar243[0] & 1) << 0x1d |
                    (uint)(auVar251[0] & 1) << 0x1e | (uint)(bVar260 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar9[0] & 1) | (uint)(auVar17[0] & 1) << 1 |
                    (uint)(auVar25[0] & 1) << 2 | (uint)(auVar33[0] & 1) << 3 |
                    (uint)(auVar41[0] & 1) << 4 | (uint)(auVar49[0] & 1) << 5 |
                    (uint)(auVar57[0] & 1) << 6 | (uint)(auVar65[0] & 1) << 7 |
                    (uint)(auVar73[0] & 1) << 8 | (uint)(auVar81[0] & 1) << 9 |
                    (uint)(auVar89[0] & 1) << 10 | (uint)(auVar97[0] & 1) << 0xb |
                    (uint)(auVar105[0] & 1) << 0xc | (uint)(auVar113[0] & 1) << 0xd |
                    (uint)(auVar121[0] & 1) << 0xe | (uint)auVar129[0] << 0xf |
                    (uint)(auVar137[0] & 1) << 0x10 | (uint)(auVar145[0] & 1) << 0x11 |
                    (uint)(auVar153[0] & 1) << 0x12 | (uint)(auVar161[0] & 1) << 0x13 |
                    (uint)(auVar169[0] & 1) << 0x14 | (uint)(auVar177[0] & 1) << 0x15 |
                    (uint)(auVar185[0] & 1) << 0x16 | (uint)auVar193[0] << 0x17 |
                    (uint)(auVar201[0] & 1) << 0x18 | (uint)(auVar209[0] & 1) << 0x19 |
                    (uint)(auVar217[0] & 1) << 0x1a | (uint)(auVar225[0] & 1) << 0x1b |
                    (uint)(auVar233[0] & 1) << 0x1c | (uint)(auVar241[0] & 1) << 0x1d |
                    (uint)(auVar249[0] & 1) << 0x1e | (uint)(bVar258 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar7[0] & 1) | (uint)(auVar15[0] & 1) << 1 |
                    (uint)(auVar23[0] & 1) << 2 | (uint)(auVar31[0] & 1) << 3 |
                    (uint)(auVar39[0] & 1) << 4 | (uint)(auVar47[0] & 1) << 5 |
                    (uint)(auVar55[0] & 1) << 6 | (uint)(auVar63[0] & 1) << 7 |
                    (uint)(auVar71[0] & 1) << 8 | (uint)(auVar79[0] & 1) << 9 |
                    (uint)(auVar87[0] & 1) << 10 | (uint)(auVar95[0] & 1) << 0xb |
                    (uint)(auVar103[0] & 1) << 0xc | (uint)(auVar111[0] & 1) << 0xd |
                    (uint)(auVar119[0] & 1) << 0xe | (uint)auVar127[0] << 0xf |
                    (uint)(auVar135[0] & 1) << 0x10 | (uint)(auVar143[0] & 1) << 0x11 |
                    (uint)(auVar151[0] & 1) << 0x12 | (uint)(auVar159[0] & 1) << 0x13 |
                    (uint)(auVar167[0] & 1) << 0x14 | (uint)(auVar175[0] & 1) << 0x15 |
                    (uint)(auVar183[0] & 1) << 0x16 | (uint)auVar191[0] << 0x17 |
                    (uint)(auVar199[0] & 1) << 0x18 | (uint)(auVar207[0] & 1) << 0x19 |
                    (uint)(auVar215[0] & 1) << 0x1a | (uint)(auVar223[0] & 1) << 0x1b |
                    (uint)(auVar231[0] & 1) << 0x1c | (uint)(auVar239[0] & 1) << 0x1d |
                    (uint)(auVar247[0] & 1) << 0x1e | (uint)(bVar256 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar8[0] & 1) | (uint)(auVar16[0] & 1) << 1 |
                    (uint)(auVar24[0] & 1) << 2 | (uint)(auVar32[0] & 1) << 3 |
                    (uint)(auVar40[0] & 1) << 4 | (uint)(auVar48[0] & 1) << 5 |
                    (uint)(auVar56[0] & 1) << 6 | (uint)(auVar64[0] & 1) << 7 |
                    (uint)(auVar72[0] & 1) << 8 | (uint)(auVar80[0] & 1) << 9 |
                    (uint)(auVar88[0] & 1) << 10 | (uint)(auVar96[0] & 1) << 0xb |
                    (uint)(auVar104[0] & 1) << 0xc | (uint)(auVar112[0] & 1) << 0xd |
                    (uint)(auVar120[0] & 1) << 0xe | (uint)auVar128[0] << 0xf |
                    (uint)(auVar136[0] & 1) << 0x10 | (uint)(auVar144[0] & 1) << 0x11 |
                    (uint)(auVar152[0] & 1) << 0x12 | (uint)(auVar160[0] & 1) << 0x13 |
                    (uint)(auVar168[0] & 1) << 0x14 | (uint)(auVar176[0] & 1) << 0x15 |
                    (uint)(auVar184[0] & 1) << 0x16 | (uint)auVar192[0] << 0x17 |
                    (uint)(auVar200[0] & 1) << 0x18 | (uint)(auVar208[0] & 1) << 0x19 |
                    (uint)(auVar216[0] & 1) << 0x1a | (uint)(auVar224[0] & 1) << 0x1b |
                    (uint)(auVar232[0] & 1) << 0x1c | (uint)(auVar240[0] & 1) << 0x1d |
                    (uint)(auVar248[0] & 1) << 0x1e | (uint)(bVar257 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar263 + 0x1c);
    }
  }
  while (uVar1 = uVar264 + 4, uVar1 <= uVar252) {
    lVar263 = 0x20;
    auVar265 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10),auVar261,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x10));
    auVar266 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x10),auVar262,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10));
    auVar267 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x20),auVar261,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x30));
    auVar268 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x30),auVar262,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x20));
    for (; uVar264 = uVar1, lVar263 != 0; lVar263 = lVar263 + -4) {
      auVar269 = auVar265 >> 7;
      auVar4 = auVar265 >> 0xf;
      auVar8 = auVar265 >> 0x17;
      auVar12 = auVar265 >> 0x1f;
      auVar16 = auVar265 >> 0x27;
      auVar20 = auVar265 >> 0x2f;
      auVar24 = auVar265 >> 0x37;
      auVar28 = auVar265 >> 0x3f;
      auVar32 = auVar265 >> 0x47;
      auVar36 = auVar265 >> 0x4f;
      auVar40 = auVar265 >> 0x57;
      auVar44 = auVar265 >> 0x5f;
      auVar48 = auVar265 >> 0x67;
      auVar52 = auVar265 >> 0x6f;
      auVar56 = auVar265 >> 0x77;
      auVar60 = auVar265 >> 0x7f;
      auVar64 = auVar265 >> 0x87;
      auVar68 = auVar265 >> 0x8f;
      auVar72 = auVar265 >> 0x97;
      auVar76 = auVar265 >> 0x9f;
      auVar80 = auVar265 >> 0xa7;
      auVar84 = auVar265 >> 0xaf;
      auVar88 = auVar265 >> 0xb7;
      auVar92 = auVar265 >> 0xbf;
      auVar96 = auVar265 >> 199;
      auVar100 = auVar265 >> 0xcf;
      auVar104 = auVar265 >> 0xd7;
      auVar108 = auVar265 >> 0xdf;
      auVar112 = auVar265 >> 0xe7;
      auVar116 = auVar265 >> 0xef;
      auVar120 = auVar265 >> 0xf7;
      bVar253 = auVar265[0x1f];
      auVar270 = auVar266 >> 7;
      auVar5 = auVar266 >> 0xf;
      auVar9 = auVar266 >> 0x17;
      auVar13 = auVar266 >> 0x1f;
      auVar17 = auVar266 >> 0x27;
      auVar21 = auVar266 >> 0x2f;
      auVar25 = auVar266 >> 0x37;
      auVar29 = auVar266 >> 0x3f;
      auVar33 = auVar266 >> 0x47;
      auVar37 = auVar266 >> 0x4f;
      auVar41 = auVar266 >> 0x57;
      auVar45 = auVar266 >> 0x5f;
      auVar49 = auVar266 >> 0x67;
      auVar53 = auVar266 >> 0x6f;
      auVar57 = auVar266 >> 0x77;
      auVar61 = auVar266 >> 0x7f;
      auVar65 = auVar266 >> 0x87;
      auVar69 = auVar266 >> 0x8f;
      auVar73 = auVar266 >> 0x97;
      auVar77 = auVar266 >> 0x9f;
      auVar81 = auVar266 >> 0xa7;
      auVar85 = auVar266 >> 0xaf;
      auVar89 = auVar266 >> 0xb7;
      auVar93 = auVar266 >> 0xbf;
      auVar97 = auVar266 >> 199;
      auVar101 = auVar266 >> 0xcf;
      auVar105 = auVar266 >> 0xd7;
      auVar109 = auVar266 >> 0xdf;
      auVar113 = auVar266 >> 0xe7;
      auVar117 = auVar266 >> 0xef;
      auVar121 = auVar266 >> 0xf7;
      bVar254 = auVar266[0x1f];
      auVar271 = auVar267 >> 7;
      auVar6 = auVar267 >> 0xf;
      auVar10 = auVar267 >> 0x17;
      auVar14 = auVar267 >> 0x1f;
      auVar18 = auVar267 >> 0x27;
      auVar22 = auVar267 >> 0x2f;
      auVar26 = auVar267 >> 0x37;
      auVar30 = auVar267 >> 0x3f;
      auVar34 = auVar267 >> 0x47;
      auVar38 = auVar267 >> 0x4f;
      auVar42 = auVar267 >> 0x57;
      auVar46 = auVar267 >> 0x5f;
      auVar50 = auVar267 >> 0x67;
      auVar54 = auVar267 >> 0x6f;
      auVar58 = auVar267 >> 0x77;
      auVar62 = auVar267 >> 0x7f;
      auVar66 = auVar267 >> 0x87;
      auVar70 = auVar267 >> 0x8f;
      auVar74 = auVar267 >> 0x97;
      auVar78 = auVar267 >> 0x9f;
      auVar82 = auVar267 >> 0xa7;
      auVar86 = auVar267 >> 0xaf;
      auVar90 = auVar267 >> 0xb7;
      auVar94 = auVar267 >> 0xbf;
      auVar98 = auVar267 >> 199;
      auVar102 = auVar267 >> 0xcf;
      auVar106 = auVar267 >> 0xd7;
      auVar110 = auVar267 >> 0xdf;
      auVar114 = auVar267 >> 0xe7;
      auVar118 = auVar267 >> 0xef;
      auVar122 = auVar267 >> 0xf7;
      bVar255 = auVar267[0x1f];
      auVar265 = vpaddb_avx2(auVar265,auVar265);
      auVar266 = vpaddb_avx2(auVar266,auVar266);
      auVar267 = vpaddb_avx2(auVar267,auVar267);
      auVar272 = auVar268 >> 7;
      auVar7 = auVar268 >> 0xf;
      auVar11 = auVar268 >> 0x17;
      auVar15 = auVar268 >> 0x1f;
      auVar19 = auVar268 >> 0x27;
      auVar23 = auVar268 >> 0x2f;
      auVar27 = auVar268 >> 0x37;
      auVar31 = auVar268 >> 0x3f;
      auVar35 = auVar268 >> 0x47;
      auVar39 = auVar268 >> 0x4f;
      auVar43 = auVar268 >> 0x57;
      auVar47 = auVar268 >> 0x5f;
      auVar51 = auVar268 >> 0x67;
      auVar55 = auVar268 >> 0x6f;
      auVar59 = auVar268 >> 0x77;
      auVar63 = auVar268 >> 0x7f;
      auVar67 = auVar268 >> 0x87;
      auVar71 = auVar268 >> 0x8f;
      auVar75 = auVar268 >> 0x97;
      auVar79 = auVar268 >> 0x9f;
      auVar83 = auVar268 >> 0xa7;
      auVar87 = auVar268 >> 0xaf;
      auVar91 = auVar268 >> 0xb7;
      auVar95 = auVar268 >> 0xbf;
      auVar99 = auVar268 >> 199;
      auVar103 = auVar268 >> 0xcf;
      auVar107 = auVar268 >> 0xd7;
      auVar111 = auVar268 >> 0xdf;
      auVar115 = auVar268 >> 0xe7;
      auVar119 = auVar268 >> 0xef;
      auVar123 = auVar268 >> 0xf7;
      bVar256 = auVar268[0x1f];
      auVar268 = vpaddb_avx2(auVar268,auVar268);
      *(int *)((long)flags + lVar263 + -4) =
           POPCOUNT((uint)(auVar271[0] & 1) | (uint)(auVar6[0] & 1) << 1 |
                    (uint)(auVar10[0] & 1) << 2 | (uint)(auVar14[0] & 1) << 3 |
                    (uint)(auVar18[0] & 1) << 4 | (uint)(auVar22[0] & 1) << 5 |
                    (uint)(auVar26[0] & 1) << 6 | (uint)(auVar30[0] & 1) << 7 |
                    (uint)(auVar34[0] & 1) << 8 | (uint)(auVar38[0] & 1) << 9 |
                    (uint)(auVar42[0] & 1) << 10 | (uint)(auVar46[0] & 1) << 0xb |
                    (uint)(auVar50[0] & 1) << 0xc | (uint)(auVar54[0] & 1) << 0xd |
                    (uint)(auVar58[0] & 1) << 0xe | (uint)auVar62[0] << 0xf |
                    (uint)(auVar66[0] & 1) << 0x10 | (uint)(auVar70[0] & 1) << 0x11 |
                    (uint)(auVar74[0] & 1) << 0x12 | (uint)(auVar78[0] & 1) << 0x13 |
                    (uint)(auVar82[0] & 1) << 0x14 | (uint)(auVar86[0] & 1) << 0x15 |
                    (uint)(auVar90[0] & 1) << 0x16 | (uint)auVar94[0] << 0x17 |
                    (uint)(auVar98[0] & 1) << 0x18 | (uint)(auVar102[0] & 1) << 0x19 |
                    (uint)(auVar106[0] & 1) << 0x1a | (uint)(auVar110[0] & 1) << 0x1b |
                    (uint)(auVar114[0] & 1) << 0x1c | (uint)(auVar118[0] & 1) << 0x1d |
                    (uint)(auVar122[0] & 1) << 0x1e | (uint)(bVar255 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar269[0] & 1) | (uint)(auVar4[0] & 1) << 1 |
                    (uint)(auVar8[0] & 1) << 2 | (uint)(auVar12[0] & 1) << 3 |
                    (uint)(auVar16[0] & 1) << 4 | (uint)(auVar20[0] & 1) << 5 |
                    (uint)(auVar24[0] & 1) << 6 | (uint)(auVar28[0] & 1) << 7 |
                    (uint)(auVar32[0] & 1) << 8 | (uint)(auVar36[0] & 1) << 9 |
                    (uint)(auVar40[0] & 1) << 10 | (uint)(auVar44[0] & 1) << 0xb |
                    (uint)(auVar48[0] & 1) << 0xc | (uint)(auVar52[0] & 1) << 0xd |
                    (uint)(auVar56[0] & 1) << 0xe | (uint)auVar60[0] << 0xf |
                    (uint)(auVar64[0] & 1) << 0x10 | (uint)(auVar68[0] & 1) << 0x11 |
                    (uint)(auVar72[0] & 1) << 0x12 | (uint)(auVar76[0] & 1) << 0x13 |
                    (uint)(auVar80[0] & 1) << 0x14 | (uint)(auVar84[0] & 1) << 0x15 |
                    (uint)(auVar88[0] & 1) << 0x16 | (uint)auVar92[0] << 0x17 |
                    (uint)(auVar96[0] & 1) << 0x18 | (uint)(auVar100[0] & 1) << 0x19 |
                    (uint)(auVar104[0] & 1) << 0x1a | (uint)(auVar108[0] & 1) << 0x1b |
                    (uint)(auVar112[0] & 1) << 0x1c | (uint)(auVar116[0] & 1) << 0x1d |
                    (uint)(auVar120[0] & 1) << 0x1e | (uint)(bVar253 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar263 + -4);
      *(int *)((long)flags + lVar263 + 0x1c) =
           POPCOUNT((uint)(auVar272[0] & 1) | (uint)(auVar7[0] & 1) << 1 |
                    (uint)(auVar11[0] & 1) << 2 | (uint)(auVar15[0] & 1) << 3 |
                    (uint)(auVar19[0] & 1) << 4 | (uint)(auVar23[0] & 1) << 5 |
                    (uint)(auVar27[0] & 1) << 6 | (uint)(auVar31[0] & 1) << 7 |
                    (uint)(auVar35[0] & 1) << 8 | (uint)(auVar39[0] & 1) << 9 |
                    (uint)(auVar43[0] & 1) << 10 | (uint)(auVar47[0] & 1) << 0xb |
                    (uint)(auVar51[0] & 1) << 0xc | (uint)(auVar55[0] & 1) << 0xd |
                    (uint)(auVar59[0] & 1) << 0xe | (uint)auVar63[0] << 0xf |
                    (uint)(auVar67[0] & 1) << 0x10 | (uint)(auVar71[0] & 1) << 0x11 |
                    (uint)(auVar75[0] & 1) << 0x12 | (uint)(auVar79[0] & 1) << 0x13 |
                    (uint)(auVar83[0] & 1) << 0x14 | (uint)(auVar87[0] & 1) << 0x15 |
                    (uint)(auVar91[0] & 1) << 0x16 | (uint)auVar95[0] << 0x17 |
                    (uint)(auVar99[0] & 1) << 0x18 | (uint)(auVar103[0] & 1) << 0x19 |
                    (uint)(auVar107[0] & 1) << 0x1a | (uint)(auVar111[0] & 1) << 0x1b |
                    (uint)(auVar115[0] & 1) << 0x1c | (uint)(auVar119[0] & 1) << 0x1d |
                    (uint)(auVar123[0] & 1) << 0x1e | (uint)(bVar256 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar270[0] & 1) | (uint)(auVar5[0] & 1) << 1 |
                    (uint)(auVar9[0] & 1) << 2 | (uint)(auVar13[0] & 1) << 3 |
                    (uint)(auVar17[0] & 1) << 4 | (uint)(auVar21[0] & 1) << 5 |
                    (uint)(auVar25[0] & 1) << 6 | (uint)(auVar29[0] & 1) << 7 |
                    (uint)(auVar33[0] & 1) << 8 | (uint)(auVar37[0] & 1) << 9 |
                    (uint)(auVar41[0] & 1) << 10 | (uint)(auVar45[0] & 1) << 0xb |
                    (uint)(auVar49[0] & 1) << 0xc | (uint)(auVar53[0] & 1) << 0xd |
                    (uint)(auVar57[0] & 1) << 0xe | (uint)auVar61[0] << 0xf |
                    (uint)(auVar65[0] & 1) << 0x10 | (uint)(auVar69[0] & 1) << 0x11 |
                    (uint)(auVar73[0] & 1) << 0x12 | (uint)(auVar77[0] & 1) << 0x13 |
                    (uint)(auVar81[0] & 1) << 0x14 | (uint)(auVar85[0] & 1) << 0x15 |
                    (uint)(auVar89[0] & 1) << 0x16 | (uint)auVar93[0] << 0x17 |
                    (uint)(auVar97[0] & 1) << 0x18 | (uint)(auVar101[0] & 1) << 0x19 |
                    (uint)(auVar105[0] & 1) << 0x1a | (uint)(auVar109[0] & 1) << 0x1b |
                    (uint)(auVar113[0] & 1) << 0x1c | (uint)(auVar117[0] & 1) << 0x1d |
                    (uint)(auVar121[0] & 1) << 0x1e | (uint)(bVar254 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar263 + 0x1c);
    }
  }
  while (uVar1 = uVar264 + 2, uVar1 <= uVar252) {
    lVar263 = 0x20;
    auVar265 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10),auVar261,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x10));
    auVar266 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar264 * 0x10 + 0x10),auVar262,
                                 *(undefined1 (*) [32])(array + uVar264 * 0x10));
    for (; uVar264 = uVar1, lVar263 != 0; lVar263 = lVar263 + -4) {
      auVar267 = auVar265 >> 7;
      auVar268 = auVar265 >> 0xf;
      auVar269 = auVar265 >> 0x17;
      auVar270 = auVar265 >> 0x1f;
      auVar271 = auVar265 >> 0x27;
      auVar272 = auVar265 >> 0x2f;
      auVar4 = auVar265 >> 0x37;
      auVar5 = auVar265 >> 0x3f;
      auVar6 = auVar265 >> 0x47;
      auVar7 = auVar265 >> 0x4f;
      auVar8 = auVar265 >> 0x57;
      auVar9 = auVar265 >> 0x5f;
      auVar10 = auVar265 >> 0x67;
      auVar11 = auVar265 >> 0x6f;
      auVar12 = auVar265 >> 0x77;
      auVar13 = auVar265 >> 0x7f;
      auVar14 = auVar265 >> 0x87;
      auVar15 = auVar265 >> 0x8f;
      auVar16 = auVar265 >> 0x97;
      auVar17 = auVar265 >> 0x9f;
      auVar18 = auVar265 >> 0xa7;
      auVar19 = auVar265 >> 0xaf;
      auVar20 = auVar265 >> 0xb7;
      auVar21 = auVar265 >> 0xbf;
      auVar22 = auVar265 >> 199;
      auVar23 = auVar265 >> 0xcf;
      auVar24 = auVar265 >> 0xd7;
      auVar25 = auVar265 >> 0xdf;
      auVar26 = auVar265 >> 0xe7;
      auVar27 = auVar265 >> 0xef;
      auVar28 = auVar265 >> 0xf7;
      bVar253 = auVar265[0x1f];
      auVar265 = vpaddb_avx2(auVar265,auVar265);
      piVar2 = (int *)((long)flags + lVar263 + -4);
      *piVar2 = *piVar2 + POPCOUNT((uint)(auVar267[0] & 1) | (uint)(auVar268[0] & 1) << 1 |
                                   (uint)(auVar269[0] & 1) << 2 | (uint)(auVar270[0] & 1) << 3 |
                                   (uint)(auVar271[0] & 1) << 4 | (uint)(auVar272[0] & 1) << 5 |
                                   (uint)(auVar4[0] & 1) << 6 | (uint)(auVar5[0] & 1) << 7 |
                                   (uint)(auVar6[0] & 1) << 8 | (uint)(auVar7[0] & 1) << 9 |
                                   (uint)(auVar8[0] & 1) << 10 | (uint)(auVar9[0] & 1) << 0xb |
                                   (uint)(auVar10[0] & 1) << 0xc | (uint)(auVar11[0] & 1) << 0xd |
                                   (uint)(auVar12[0] & 1) << 0xe | (uint)auVar13[0] << 0xf |
                                   (uint)(auVar14[0] & 1) << 0x10 | (uint)(auVar15[0] & 1) << 0x11 |
                                   (uint)(auVar16[0] & 1) << 0x12 | (uint)(auVar17[0] & 1) << 0x13 |
                                   (uint)(auVar18[0] & 1) << 0x14 | (uint)(auVar19[0] & 1) << 0x15 |
                                   (uint)(auVar20[0] & 1) << 0x16 | (uint)auVar21[0] << 0x17 |
                                   (uint)(auVar22[0] & 1) << 0x18 | (uint)(auVar23[0] & 1) << 0x19 |
                                   (uint)(auVar24[0] & 1) << 0x1a | (uint)(auVar25[0] & 1) << 0x1b |
                                   (uint)(auVar26[0] & 1) << 0x1c | (uint)(auVar27[0] & 1) << 0x1d |
                                   (uint)(auVar28[0] & 1) << 0x1e | (uint)(bVar253 >> 7) << 0x1f);
      auVar267 = auVar266 >> 7;
      auVar268 = auVar266 >> 0xf;
      auVar269 = auVar266 >> 0x17;
      auVar270 = auVar266 >> 0x1f;
      auVar271 = auVar266 >> 0x27;
      auVar272 = auVar266 >> 0x2f;
      auVar4 = auVar266 >> 0x37;
      auVar5 = auVar266 >> 0x3f;
      auVar6 = auVar266 >> 0x47;
      auVar7 = auVar266 >> 0x4f;
      auVar8 = auVar266 >> 0x57;
      auVar9 = auVar266 >> 0x5f;
      auVar10 = auVar266 >> 0x67;
      auVar11 = auVar266 >> 0x6f;
      auVar12 = auVar266 >> 0x77;
      auVar13 = auVar266 >> 0x7f;
      auVar14 = auVar266 >> 0x87;
      auVar15 = auVar266 >> 0x8f;
      auVar16 = auVar266 >> 0x97;
      auVar17 = auVar266 >> 0x9f;
      auVar18 = auVar266 >> 0xa7;
      auVar19 = auVar266 >> 0xaf;
      auVar20 = auVar266 >> 0xb7;
      auVar21 = auVar266 >> 0xbf;
      auVar22 = auVar266 >> 199;
      auVar23 = auVar266 >> 0xcf;
      auVar24 = auVar266 >> 0xd7;
      auVar25 = auVar266 >> 0xdf;
      auVar26 = auVar266 >> 0xe7;
      auVar27 = auVar266 >> 0xef;
      auVar28 = auVar266 >> 0xf7;
      bVar253 = auVar266[0x1f];
      auVar266 = vpaddb_avx2(auVar266,auVar266);
      piVar2 = (int *)((long)flags + lVar263 + 0x1c);
      *piVar2 = *piVar2 + POPCOUNT((uint)(auVar267[0] & 1) | (uint)(auVar268[0] & 1) << 1 |
                                   (uint)(auVar269[0] & 1) << 2 | (uint)(auVar270[0] & 1) << 3 |
                                   (uint)(auVar271[0] & 1) << 4 | (uint)(auVar272[0] & 1) << 5 |
                                   (uint)(auVar4[0] & 1) << 6 | (uint)(auVar5[0] & 1) << 7 |
                                   (uint)(auVar6[0] & 1) << 8 | (uint)(auVar7[0] & 1) << 9 |
                                   (uint)(auVar8[0] & 1) << 10 | (uint)(auVar9[0] & 1) << 0xb |
                                   (uint)(auVar10[0] & 1) << 0xc | (uint)(auVar11[0] & 1) << 0xd |
                                   (uint)(auVar12[0] & 1) << 0xe | (uint)auVar13[0] << 0xf |
                                   (uint)(auVar14[0] & 1) << 0x10 | (uint)(auVar15[0] & 1) << 0x11 |
                                   (uint)(auVar16[0] & 1) << 0x12 | (uint)(auVar17[0] & 1) << 0x13 |
                                   (uint)(auVar18[0] & 1) << 0x14 | (uint)(auVar19[0] & 1) << 0x15 |
                                   (uint)(auVar20[0] & 1) << 0x16 | (uint)auVar21[0] << 0x17 |
                                   (uint)(auVar22[0] & 1) << 0x18 | (uint)(auVar23[0] & 1) << 0x19 |
                                   (uint)(auVar24[0] & 1) << 0x1a | (uint)(auVar25[0] & 1) << 0x1b |
                                   (uint)(auVar26[0] & 1) << 0x1c | (uint)(auVar27[0] & 1) << 0x1d |
                                   (uint)(auVar28[0] & 1) << 0x1e | (uint)(bVar253 >> 7) << 0x1f);
    }
  }
  for (uVar264 = uVar264 << 4; uVar264 < len; uVar264 = uVar264 + 1) {
    uVar3 = array[uVar264];
    for (lVar263 = 0; lVar263 != 0x10; lVar263 = lVar263 + 1) {
      flags[lVar263] = flags[lVar263] + (uint)((uVar3 >> ((uint)lVar263 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll8(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 8 <= n_cycles; i += 8) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7) 
        
#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
       U(0,1) U(2, 3) U(4, 5) U(6, 7)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3) A(4, 5) A(6, 7)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) input##p = P0(p) P0(k)
            P(0,1) P(2, 3) P(4, 5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3)
            P(0,1) P( 2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    return 0;
}